

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O2

void DSA_free(DSA *r)

{
  int iVar1;
  
  if (r != (DSA *)0x0) {
    iVar1 = CRYPTO_refcount_dec_and_test_zero((CRYPTO_refcount_t *)&(r->ex_data).dummy);
    if (iVar1 != 0) {
      CRYPTO_free_ex_data(0x6a6f98,r,(CRYPTO_EX_DATA *)&r->meth);
      BN_clear_free(*(BIGNUM **)r);
      BN_clear_free((BIGNUM *)r->version);
      BN_clear_free(*(BIGNUM **)&r->write_params);
      BN_clear_free(r->p);
      BN_clear_free(r->q);
      BN_MONT_CTX_free(*(BN_MONT_CTX **)&r->references);
      BN_MONT_CTX_free((BN_MONT_CTX *)(r->ex_data).sk);
      CRYPTO_MUTEX_cleanup((CRYPTO_MUTEX *)&r->g);
      OPENSSL_free(r);
      return;
    }
  }
  return;
}

Assistant:

void DSA_free(DSA *dsa) {
  if (dsa == NULL) {
    return;
  }

  if (!CRYPTO_refcount_dec_and_test_zero(&dsa->references)) {
    return;
  }

  CRYPTO_free_ex_data(&g_ex_data_class, dsa, &dsa->ex_data);

  BN_clear_free(dsa->p);
  BN_clear_free(dsa->q);
  BN_clear_free(dsa->g);
  BN_clear_free(dsa->pub_key);
  BN_clear_free(dsa->priv_key);
  BN_MONT_CTX_free(dsa->method_mont_p);
  BN_MONT_CTX_free(dsa->method_mont_q);
  CRYPTO_MUTEX_cleanup(&dsa->method_mont_lock);
  OPENSSL_free(dsa);
}